

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

int ikcp_send(ikcpcb *kcp,char *buffer,int len)

{
  uint uVar1;
  IQUEUEHEAD *pIVar2;
  IQUEUEHEAD *pIVar3;
  IQUEUEHEAD *pIVar4;
  uint uVar5;
  IKCPSEG *pIVar6;
  IUINT32 IVar7;
  ikcpcb *piVar8;
  int iVar9;
  IUINT32 IVar10;
  IUINT32 IVar11;
  IUINT32 IVar12;
  bool bVar13;
  ikcpcb *kcp_00;
  
  uVar5 = kcp->mss;
  if (uVar5 == 0) {
    __assert_fail("kcp->mss > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x1da,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  piVar8 = (ikcpcb *)(ulong)(uint)len;
  if (-1 < len) {
    if (kcp->stream != 0) {
      if (&kcp->snd_queue != (kcp->snd_queue).next) {
        pIVar2 = (kcp->snd_queue).prev;
        uVar1 = *(uint *)((long)&pIVar2[2].prev + 4);
        iVar9 = uVar5 - uVar1;
        if (uVar1 <= uVar5 && iVar9 != 0) {
          if (len <= iVar9) {
            iVar9 = len;
          }
          pIVar6 = ikcp_segment_new((ikcpcb *)(ulong)(uVar1 + iVar9),(int)buffer);
          if (pIVar6 == (IKCPSEG *)0x0) {
            __assert_fail("seg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                          ,0x1e5,"int ikcp_send(ikcpcb *, const char *, int)");
          }
          pIVar3 = (kcp->snd_queue).prev;
          (pIVar6->node).prev = pIVar3;
          (pIVar6->node).next = &kcp->snd_queue;
          pIVar3->next = &pIVar6->node;
          (kcp->snd_queue).prev = &pIVar6->node;
          memcpy(pIVar6->data,pIVar2 + 4,(ulong)*(uint *)((long)&pIVar2[2].prev + 4));
          if (buffer == (char *)0x0) {
            buffer = (char *)0x0;
          }
          else {
            memcpy(pIVar6->data + *(uint *)((long)&pIVar2[2].prev + 4),buffer,(long)iVar9);
            buffer = buffer + iVar9;
          }
          pIVar6->len = *(int *)((long)&pIVar2[2].prev + 4) + iVar9;
          pIVar6->frg = 0;
          pIVar3 = pIVar2->next;
          pIVar4 = pIVar2->prev;
          pIVar3->prev = pIVar4;
          pIVar4->next = pIVar3;
          pIVar2->next = pIVar2;
          pIVar2->prev = pIVar2;
          ikcp_free(pIVar2);
          piVar8 = (ikcpcb *)(ulong)(uint)(len - iVar9);
        }
      }
      if ((int)piVar8 < 1) {
        return 0;
      }
      uVar5 = kcp->mss;
    }
    if ((int)uVar5 < (int)piVar8) {
      uVar5 = (((int)piVar8 + uVar5) - 1) / uVar5;
      if (0x7f < (int)uVar5) {
        return -2;
      }
    }
    else {
      uVar5 = 1;
    }
    IVar12 = uVar5 + (uVar5 == 0);
    IVar11 = 0;
    if (0 < (int)IVar12) {
      IVar11 = IVar12;
    }
    while( true ) {
      IVar12 = IVar12 - 1;
      bVar13 = IVar11 == 0;
      IVar11 = IVar11 - 1;
      if (bVar13) {
        return 0;
      }
      iVar9 = (int)piVar8;
      kcp_00 = (ikcpcb *)(ulong)kcp->mss;
      if (iVar9 < (int)kcp->mss) {
        kcp_00 = piVar8;
      }
      IVar10 = (IUINT32)kcp_00;
      pIVar6 = ikcp_segment_new(kcp_00,(int)buffer);
      if (pIVar6 == (IKCPSEG *)0x0) break;
      if ((buffer != (char *)0x0) && (0 < iVar9)) {
        memcpy(pIVar6->data,buffer,(long)(int)IVar10);
      }
      pIVar6->len = IVar10;
      IVar7 = 0;
      if (kcp->stream == 0) {
        IVar7 = IVar12;
      }
      pIVar6->frg = IVar7;
      pIVar2 = (kcp->snd_queue).prev;
      (pIVar6->node).prev = pIVar2;
      (pIVar6->node).next = &kcp->snd_queue;
      pIVar2->next = &pIVar6->node;
      kcp->nsnd_que = kcp->nsnd_que + 1;
      (kcp->snd_queue).prev = &pIVar6->node;
      if (buffer != (char *)0x0) {
        buffer = buffer + (int)IVar10;
      }
      piVar8 = (ikcpcb *)(ulong)(iVar9 - IVar10);
    }
    __assert_fail("seg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x206,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  return -1;
}

Assistant:

int ikcp_send(ikcpcb *kcp, const char *buffer, int len)
{
	IKCPSEG *seg;
	int count, i;

	assert(kcp->mss > 0);
	if (len < 0) return -1;

	// append to previous segment in streaming mode (if possible)
	if (kcp->stream != 0) {
		if (!iqueue_is_empty(&kcp->snd_queue)) {
			IKCPSEG *old = iqueue_entry(kcp->snd_queue.prev, IKCPSEG, node);
			if (old->len < kcp->mss) {
				int capacity = kcp->mss - old->len;
				int extend = (len < capacity)? len : capacity;
				seg = ikcp_segment_new(kcp, old->len + extend);
				assert(seg);
				if (seg == NULL) {
					return -2;
				}
				iqueue_add_tail(&seg->node, &kcp->snd_queue);
				memcpy(seg->data, old->data, old->len);
				if (buffer) {
					memcpy(seg->data + old->len, buffer, extend);
					buffer += extend;
				}
				seg->len = old->len + extend;
				seg->frg = 0;
				len -= extend;
				iqueue_del_init(&old->node);
				ikcp_segment_delete(kcp, old);
			}
		}
		if (len <= 0) {
			return 0;
		}
	}

	if (len <= (int)kcp->mss) count = 1;
	else count = (len + kcp->mss - 1) / kcp->mss;

	if (count >= (int)IKCP_WND_RCV) return -2;

	if (count == 0) count = 1;

	// fragment
	for (i = 0; i < count; i++) {
		int size = len > (int)kcp->mss ? (int)kcp->mss : len;
		seg = ikcp_segment_new(kcp, size);
		assert(seg);
		if (seg == NULL) {
			return -2;
		}
		if (buffer && len > 0) {
			memcpy(seg->data, buffer, size);
		}
		seg->len = size;
		seg->frg = (kcp->stream == 0)? (count - i - 1) : 0;
		iqueue_init(&seg->node);
		iqueue_add_tail(&seg->node, &kcp->snd_queue);
		kcp->nsnd_que++;
		if (buffer) {
			buffer += size;
		}
		len -= size;
	}

	return 0;
}